

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huffman_coding.cc
# Opt level: O2

bool __thiscall
sptk::HuffmanCoding::Run
          (HuffmanCoding *this,vector<double,_std::allocator<double>_> *probabilities,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *codewords)

{
  Node *node;
  Node *pNVar1;
  pointer ppNVar2;
  int iVar3;
  int i;
  long lVar4;
  bool bVar5;
  size_type __new_size;
  double dVar6;
  allocator local_79;
  priority_queue<(anonymous_namespace)::Node_*,_std::vector<(anonymous_namespace)::Node_*,_std::allocator<(anonymous_namespace)::Node_*>_>,_(anonymous_namespace)::Compare>
  tree;
  string local_50;
  
  if (this->is_valid_ == true) {
    bVar5 = false;
    if (codewords !=
        (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)0x0) {
      __new_size = (long)(probabilities->super__Vector_base<double,_std::allocator<double>_>).
                         _M_impl.super__Vector_impl_data._M_finish -
                   (long)(probabilities->super__Vector_base<double,_std::allocator<double>_>).
                         _M_impl.super__Vector_impl_data._M_start >> 3;
      iVar3 = this->num_element_;
      bVar5 = false;
      if (__new_size == (long)iVar3) {
        if ((long)(codewords->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish -
            (long)(codewords->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start >> 5 != __new_size) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::resize(codewords,__new_size);
          iVar3 = this->num_element_;
        }
        if (iVar3 == 1) {
          std::__cxx11::string::assign
                    ((char *)(codewords->
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start);
          bVar5 = true;
        }
        else {
          tree.c.
          super__Vector_base<(anonymous_namespace)::Node_*,_std::allocator<(anonymous_namespace)::Node_*>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          tree.c.
          super__Vector_base<(anonymous_namespace)::Node_*,_std::allocator<(anonymous_namespace)::Node_*>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          tree.c.
          super__Vector_base<(anonymous_namespace)::Node_*,_std::allocator<(anonymous_namespace)::Node_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          for (lVar4 = 0; lVar4 < iVar3; lVar4 = lVar4 + 1) {
            local_50._M_dataplus._M_p = (pointer)operator_new(0x28);
            dVar6 = (probabilities->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                    super__Vector_impl_data._M_start[lVar4];
            *(undefined ***)local_50._M_dataplus._M_p = &PTR__Node_00111cd0;
            *(int *)(local_50._M_dataplus._M_p + 8) = (int)lVar4;
            *(double *)(local_50._M_dataplus._M_p + 0x10) = dVar6;
            local_50._M_dataplus._M_p[0x18] = '\0';
            local_50._M_dataplus._M_p[0x19] = '\0';
            local_50._M_dataplus._M_p[0x1a] = '\0';
            local_50._M_dataplus._M_p[0x1b] = '\0';
            local_50._M_dataplus._M_p[0x1c] = '\0';
            local_50._M_dataplus._M_p[0x1d] = '\0';
            local_50._M_dataplus._M_p[0x1e] = '\0';
            local_50._M_dataplus._M_p[0x1f] = '\0';
            local_50._M_dataplus._M_p[0x20] = '\0';
            local_50._M_dataplus._M_p[0x21] = '\0';
            local_50._M_dataplus._M_p[0x22] = '\0';
            local_50._M_dataplus._M_p[0x23] = '\0';
            local_50._M_dataplus._M_p[0x24] = '\0';
            local_50._M_dataplus._M_p[0x25] = '\0';
            local_50._M_dataplus._M_p[0x26] = '\0';
            local_50._M_dataplus._M_p[0x27] = '\0';
            std::
            priority_queue<(anonymous_namespace)::Node_*,_std::vector<(anonymous_namespace)::Node_*,_std::allocator<(anonymous_namespace)::Node_*>_>,_(anonymous_namespace)::Compare>
            ::push(&tree,(value_type *)&local_50);
            iVar3 = this->num_element_;
          }
          while( true ) {
            ppNVar2 = tree.c.
                      super__Vector_base<(anonymous_namespace)::Node_*,_std::allocator<(anonymous_namespace)::Node_*>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            node = *tree.c.
                    super__Vector_base<(anonymous_namespace)::Node_*,_std::allocator<(anonymous_namespace)::Node_*>_>
                    ._M_impl.super__Vector_impl_data._M_start;
            if ((ulong)((long)tree.c.
                              super__Vector_base<(anonymous_namespace)::Node_*,_std::allocator<(anonymous_namespace)::Node_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)tree.c.
                             super__Vector_base<(anonymous_namespace)::Node_*,_std::allocator<(anonymous_namespace)::Node_*>_>
                             ._M_impl.super__Vector_impl_data._M_start) < 9) break;
            std::
            priority_queue<(anonymous_namespace)::Node_*,_std::vector<(anonymous_namespace)::Node_*,_std::allocator<(anonymous_namespace)::Node_*>_>,_(anonymous_namespace)::Compare>
            ::pop(&tree);
            pNVar1 = *tree.c.
                      super__Vector_base<(anonymous_namespace)::Node_*,_std::allocator<(anonymous_namespace)::Node_*>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            std::
            priority_queue<(anonymous_namespace)::Node_*,_std::vector<(anonymous_namespace)::Node_*,_std::allocator<(anonymous_namespace)::Node_*>_>,_(anonymous_namespace)::Compare>
            ::pop(&tree);
            local_50._M_dataplus._M_p = (pointer)operator_new(0x28);
            *(undefined ***)local_50._M_dataplus._M_p = &PTR__Node_00111cd0;
            local_50._M_dataplus._M_p[8] = -1;
            local_50._M_dataplus._M_p[9] = -1;
            local_50._M_dataplus._M_p[10] = -1;
            local_50._M_dataplus._M_p[0xb] = -1;
            dVar6 = 0.0;
            if (pNVar1 != (Node *)0x0 && node != (Node *)0x0) {
              dVar6 = node->probability_ + pNVar1->probability_;
            }
            *(double *)(local_50._M_dataplus._M_p + 0x10) = dVar6;
            *(Node **)(local_50._M_dataplus._M_p + 0x18) = node;
            *(Node **)(local_50._M_dataplus._M_p + 0x20) = pNVar1;
            std::
            priority_queue<(anonymous_namespace)::Node_*,_std::vector<(anonymous_namespace)::Node_*,_std::allocator<(anonymous_namespace)::Node_*>_>,_(anonymous_namespace)::Compare>
            ::push(&tree,(value_type *)&local_50);
          }
          std::__cxx11::string::string((string *)&local_50,"",&local_79);
          anon_unknown.dwarf_ba46::Encode(node,&local_50,codewords);
          std::__cxx11::string::~string((string *)&local_50);
          bVar5 = true;
          anon_unknown.dwarf_ba46::Free(*ppNVar2);
          std::
          priority_queue<(anonymous_namespace)::Node_*,_std::vector<(anonymous_namespace)::Node_*,_std::allocator<(anonymous_namespace)::Node_*>_>,_(anonymous_namespace)::Compare>
          ::~priority_queue(&tree);
        }
      }
    }
  }
  else {
    bVar5 = false;
  }
  return bVar5;
}

Assistant:

bool HuffmanCoding::Run(const std::vector<double>& probabilities,
                        std::vector<std::string>* codewords) const {
  // Check inputs.
  if (!is_valid_ ||
      probabilities.size() != static_cast<std::size_t>(num_element_) ||
      NULL == codewords) {
    return false;
  }

  // Prepare memories.
  if (codewords->size() != static_cast<std::size_t>(num_element_)) {
    codewords->resize(num_element_);
  }

  if (1 == num_element_) {
    (*codewords)[0] = "0";
    return true;
  }

  std::priority_queue<Node*, std::vector<Node*>, Compare> tree;

  try {
    for (int i(0); i < num_element_; ++i) {
      tree.push(new Node(i, probabilities[i]));
    }
    while (1 < tree.size()) {
      const Node* left(tree.top());
      tree.pop();
      const Node* right(tree.top());
      tree.pop();

      try {
        tree.push(new Node(left, right));
      } catch (...) {
        delete left;
        delete right;
        throw;
      }
    }
    Encode(tree.top(), "", codewords);
    Free(tree.top());
  } catch (...) {
    while (!tree.empty()) {
      Free(tree.top());
      tree.pop();
    }
    return false;
  }

  return true;
}